

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_crc32.c
# Opt level: O0

uint32_t crc32c_sb8_64_bit(uint32_t crc,uchar *p_buf,uint32_t length,uint32_t init_bytes)

{
  uint uVar1;
  uint *puVar2;
  uint32_t end_bytes;
  uint32_t running_length;
  uint32_t term2;
  uint32_t term1;
  uint32_t li;
  uint32_t init_bytes_local;
  uint32_t length_local;
  uchar *p_buf_local;
  uint32_t crc_local;
  
  _init_bytes_local = (uint *)p_buf;
  p_buf_local._4_4_ = crc;
  for (term2 = 0; term2 < init_bytes; term2 = term2 + 1) {
    p_buf_local._4_4_ =
         sctp_crc_tableil8_o32[(p_buf_local._4_4_ ^ (byte)*_init_bytes_local) & 0xff] ^
         p_buf_local._4_4_ >> 8;
    _init_bytes_local = (uint *)((long)_init_bytes_local + 1);
  }
  for (term2 = 0; term2 < length - init_bytes >> 3; term2 = term2 + 1) {
    uVar1 = *_init_bytes_local ^ p_buf_local._4_4_;
    puVar2 = _init_bytes_local + 1;
    p_buf_local._4_4_ =
         sctp_crc_tableil8_o88[uVar1 & 0xff] ^ sctp_crc_tableil8_o80[uVar1 >> 8 & 0xff] ^
         sctp_crc_tableil8_o72[uVar1 >> 0x10 & 0xff] ^ sctp_crc_tableil8_o64[uVar1 >> 0x18] ^
         sctp_crc_tableil8_o56[*puVar2 & 0xff] ^ sctp_crc_tableil8_o48[*puVar2 >> 8 & 0xff] ^
         sctp_crc_tableil8_o40[*puVar2 >> 0x10 & 0xff] ^ sctp_crc_tableil8_o32[*puVar2 >> 0x18];
    _init_bytes_local = _init_bytes_local + 2;
  }
  for (term2 = 0; term2 < (length - init_bytes) - (length - init_bytes & 0xfffffff8);
      term2 = term2 + 1) {
    p_buf_local._4_4_ =
         sctp_crc_tableil8_o32[(p_buf_local._4_4_ ^ (byte)*_init_bytes_local) & 0xff] ^
         p_buf_local._4_4_ >> 8;
    _init_bytes_local = (uint *)((long)_init_bytes_local + 1);
  }
  return p_buf_local._4_4_;
}

Assistant:

static uint32_t crc32c_sb8_64_bit(uint32_t crc, const unsigned char *p_buf,
				  uint32_t length, uint32_t init_bytes)
{
	uint32_t li;
	uint32_t term1, term2;
	uint32_t running_length;
	uint32_t end_bytes;

	running_length = ((length - init_bytes) / 8) * 8;
	end_bytes = length - init_bytes - running_length;

	for (li = 0; li < init_bytes; li++)
		crc =
		    sctp_crc_tableil8_o32[(crc ^ *p_buf++) & 0x000000FF] ^ (crc
									    >>
									    8);
	for (li = 0; li < running_length / 8; li++) {
#if BYTE_ORDER == BIG_ENDIAN
		crc ^= *p_buf++;
		crc ^= (*p_buf++) << 8;
		crc ^= (*p_buf++) << 16;
		crc ^= (*p_buf++) << 24;
#else
		crc ^= *(const uint32_t *)p_buf;
		p_buf += 4;
#endif
		term1 =
		    sctp_crc_tableil8_o88[crc & 0x000000FF] ^
		    sctp_crc_tableil8_o80[(crc >> 8) & 0x000000FF];
		term2 = crc >> 16;
		crc =
		    term1 ^ sctp_crc_tableil8_o72[term2 & 0x000000FF] ^
		    sctp_crc_tableil8_o64[(term2 >> 8) & 0x000000FF];

#if BYTE_ORDER == BIG_ENDIAN
		crc ^= sctp_crc_tableil8_o56[*p_buf++];
		crc ^= sctp_crc_tableil8_o48[*p_buf++];
		crc ^= sctp_crc_tableil8_o40[*p_buf++];
		crc ^= sctp_crc_tableil8_o32[*p_buf++];
#else
		term1 =
		    sctp_crc_tableil8_o56[(*(const uint32_t *)p_buf) &
					  0x000000FF] ^
		    sctp_crc_tableil8_o48[((*(const uint32_t *)p_buf) >> 8) &
					  0x000000FF];

		term2 = (*(const uint32_t *)p_buf) >> 16;
		crc =
		    crc ^ term1 ^ sctp_crc_tableil8_o40[term2 & 0x000000FF] ^
		    sctp_crc_tableil8_o32[(term2 >> 8) & 0x000000FF];
		p_buf += 4;
#endif
	}
	for (li = 0; li < end_bytes; li++)
		crc =
		    sctp_crc_tableil8_o32[(crc ^ *p_buf++) & 0x000000FF] ^ (crc
									    >>
									    8);
	return crc;
}